

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O1

void __thiscall Kernel::Problem::refreshProperty(Problem *this)

{
  undefined4 uVar1;
  Property *pPVar2;
  bool *pbVar3;
  long lVar4;
  Property *pPVar5;
  ulong uVar6;
  
  lVar4 = DAT_00b7e1c0;
  uVar1 = *(undefined4 *)(DAT_00b7e1c0 + 600);
  *(undefined4 *)(DAT_00b7e1c0 + 600) = 2;
  pPVar2 = this->_property;
  this->_propertyValid = true;
  pPVar5 = Shell::Property::scan(this->_units);
  this->_property = pPVar5;
  if (pPVar2 != (Property *)0x0) {
    ::Lib::
    DHMap<std::pair<Kernel::Theory::Interpretation,_Kernel::OperatorType_*>,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
    ::~DHMap(&(pPVar2->_polymorphicInterpretations)._map);
    pbVar3 = (pPVar2->_interpretationPresence)._array;
    if (pbVar3 != (bool *)0x0) {
      uVar6 = (pPVar2->_interpretationPresence)._capacity + 0xf & 0xfffffffffffffff0;
      if (uVar6 == 0) {
        *(undefined8 *)pbVar3 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pbVar3;
      }
      else if (uVar6 < 0x11) {
        *(undefined8 *)pbVar3 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pbVar3;
      }
      else if (uVar6 < 0x19) {
        *(undefined8 *)pbVar3 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pbVar3;
      }
      else if (uVar6 < 0x21) {
        *(undefined8 *)pbVar3 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pbVar3;
      }
      else if (uVar6 < 0x31) {
        *(undefined8 *)pbVar3 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pbVar3;
      }
      else if (uVar6 < 0x41) {
        *(undefined8 *)pbVar3 = ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        ::Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pbVar3;
      }
      else {
        operator_delete(pbVar3,0x10);
      }
    }
    ::Lib::Array<bool>::~Array(&pPVar2->_usesSort);
    ::Lib::DHMap<int,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              (&(pPVar2->_symbolsInFormula)._map);
    operator_delete(pPVar2,0x118);
  }
  this->_property->_smtlibLogic = this->_smtlibLogic;
  readDetailsFromProperty(this);
  *(undefined4 *)(lVar4 + 600) = uVar1;
  return;
}

Assistant:

void Problem::refreshProperty() const
{
  TIME_TRACE(TimeTrace::PROPERTY_EVALUATION);
  ScopedLet<ExecutionPhase> phaseLet(env.statistics->phase, ExecutionPhase::PROPERTY_SCANNING);

  auto oldProp = _property;
  _propertyValid = true;
  _property = Property::scan(_units);
  if(oldProp) {
    delete oldProp;
  }
  ASS(_property);
  _property->setSMTLIBLogic(getSMTLIBLogic());
  readDetailsFromProperty();
}